

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBuiltinPrecisionTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles31::Functional::createBuiltinPrecisionTests(Context *context)

{
  TestCaseGroup *this;
  ShaderType local_4c;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es31Cases;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,context,"precision","Builtin precision tests");
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases();
  deqp::gls::BuiltinPrecisionTests::createES31BuiltinCases();
  local_4c = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_4c);
  deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,
             es3Cases.
             super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
             .m_data.ptr,&shaderTypes,(TestCaseGroup *)this);
  if (shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_4c = SHADERTYPE_VERTEX;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_4c);
  local_4c = SHADERTYPE_FRAGMENT;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_4c);
  local_4c = SHADERTYPE_COMPUTE;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::emplace_back<glu::ShaderType>
            (&shaderTypes,&local_4c);
  deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,
             es31Cases.
             super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
             .m_data.ptr,&shaderTypes,(TestCaseGroup *)this);
  de::details::
  UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~UniqueBase(&es31Cases.
                 super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
               );
  de::details::
  UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~UniqueBase(&es3Cases.
                 super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
               );
  std::_Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~_Vector_base
            (&shaderTypes.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>);
  return this;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases		= bpt::createES3BuiltinCases();
	de::MovePtr<const bpt::CaseFactories>	es31Cases		= bpt::createES31BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);

	shaderTypes.clear();
	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);
	shaderTypes.push_back(glu::SHADERTYPE_COMPUTE);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es31Cases,
								  shaderTypes,
								  *group);
	return group;
}